

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O2

void __thiscall soul::Value::Value(Value *this,Type *t)

{
  uint64_t uVar1;
  
  Type::Type(&this->type,t);
  uVar1 = Type::getPackedSizeInBytes(&this->type);
  (this->allocatedData).allocatedSize = uVar1;
  (this->allocatedData).allocatedData.items = (uchar *)(this->allocatedData).allocatedData.space;
  (this->allocatedData).allocatedData.numActive = 0;
  (this->allocatedData).allocatedData.numAllocated = 8;
  return;
}

Assistant:

Value::Value (Type t)  : type (std::move (t)), allocatedData ((size_t) type.getPackedSizeInBytes()) {}